

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polyline_shape.cc
# Opt level: O3

void __thiscall
S2LaxPolylineShape::S2LaxPolylineShape
          (S2LaxPolylineShape *this,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  (this->super_S2Shape).id_ = -1;
  (this->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2LaxPolylineShape_002bc338;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = (Vector3<double> *)0x0;
  Init(this,vertices);
  return;
}

Assistant:

S2LaxPolylineShape::S2LaxPolylineShape(const vector<S2Point>& vertices) {
  Init(vertices);
}